

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O1

int __thiscall NetOptimize::eliminate_flatten_after_global_pooling(NetOptimize *this)

{
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar1;
  Layer *pLVar2;
  Layer *pLVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  
  pvVar1 = (this->super_ModelWriter).layers;
  lVar9 = (long)(pvVar1->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pvVar1->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar9 != 0) {
    uVar10 = lVar9 >> 3;
    lVar9 = 0;
    do {
      iVar5 = std::__cxx11::string::compare
                        ((char *)&(((this->super_ModelWriter).layers)->
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)
                                  ._M_impl.super__Vector_impl_data._M_start[lVar9]->type);
      if ((iVar5 == 0) &&
         (pLVar2 = (((this->super_ModelWriter).layers)->
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                   super__Vector_impl_data._M_start[lVar9],
         *(int *)((long)&pLVar2[1].userdata + 4) != 0)) {
        uVar7 = lVar9 + 1;
        uVar8 = uVar7;
        if (uVar7 < uVar10) {
          iVar5 = *(pLVar2->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          do {
            iVar6 = std::__cxx11::string::compare
                              ((char *)&(((this->super_ModelWriter).layers)->
                                        super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                        )._M_impl.super__Vector_impl_data._M_start[uVar7]->type);
            if (((iVar6 == 0) &&
                (pLVar3 = (((this->super_ModelWriter).layers)->
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                          .super__Vector_impl_data._M_start[uVar7],
                piVar4 = (pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                (long)*(pointer *)
                       ((long)&(pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl + 8) - (long)piVar4 == 4)) &&
               (uVar8 = uVar7, *piVar4 == iVar5)) break;
            uVar7 = uVar7 + 1;
            uVar8 = uVar10;
          } while (uVar7 < uVar10);
        }
        if (uVar8 != uVar10) {
          pLVar3 = (((this->super_ModelWriter).layers)->
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar8];
          fprintf(_stderr,"eliminate_flatten_after_global_pooling %s %s\n",
                  (pLVar2->name)._M_dataplus._M_p,(pLVar3->name)._M_dataplus._M_p);
          iVar5 = *(pLVar3->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          *(pLVar2->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start = iVar5;
          (((this->super_ModelWriter).blobs)->
          super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
          super__Vector_impl_data._M_start[iVar5].producer = (int)lVar9;
          std::__cxx11::string::_M_replace
                    ((ulong)&pLVar3->type,0,(char *)(pLVar3->type)._M_string_length,0x32319a);
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != uVar10 + (uVar10 == 0));
  }
  return 0;
}

Assistant:

int NetOptimize::eliminate_flatten_after_global_pooling()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "Pooling")
            continue;

        ncnn::Pooling* pooling = (ncnn::Pooling*)layers[i];
        if (pooling->global_pooling == 0)
            continue;

        // Pooling - Flatten
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "Flatten")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        ncnn::Flatten* flatten = (ncnn::Flatten*)layers[j];

        fprintf(stderr, "eliminate_flatten_after_global_pooling %s %s\n", pooling->name.c_str(), flatten->name.c_str());

        int top_blob_index_final = flatten->tops[0];
        pooling->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        flatten->type = "ncnnfused";
    }

    return 0;
}